

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void RestartModel(CPpmd7 *p)

{
  ushort uVar1;
  CPpmd_State *p_00;
  CPpmd_See *pCVar2;
  CPpmd7_Context *pCVar3;
  uint local_44;
  CPpmd_See *s_1;
  UInt16 val;
  UInt16 *dest;
  CPpmd_State *s;
  uint local_18;
  uint m;
  uint k;
  uint i;
  CPpmd7 *p_local;
  
  memset(p->FreeList,0,0x98);
  p->Text = p->Base + p->AlignOffset;
  p->HiUnit = p->Text + p->Size;
  p->UnitsStart = p->HiUnit + -(ulong)((p->Size / 0x60) * 0x54);
  p->LoUnit = p->HiUnit + -(ulong)((p->Size / 0x60) * 0x54);
  p->GlueCount = 0;
  p->OrderFall = p->MaxOrder;
  if (p->MaxOrder < 0xc) {
    local_44 = p->MaxOrder;
  }
  else {
    local_44 = 0xc;
  }
  p->InitRL = -1 - local_44;
  p->RunLength = -1 - local_44;
  p->PrevSuccess = 0;
  pCVar3 = (CPpmd7_Context *)(p->HiUnit + -0xc);
  p->HiUnit = (Byte *)pCVar3;
  p->MaxContext = pCVar3;
  p->MinContext = pCVar3;
  p->MinContext->Suffix = 0;
  p->MinContext->NumStats = 0x100;
  p->MinContext->SummFreq = 0x101;
  p->FoundState = (CPpmd_State *)p->LoUnit;
  p->LoUnit = p->LoUnit + 0x600;
  p->MinContext->Stats = (int)p->FoundState - (int)p->Base;
  for (m = 0; m < 0x100; m = m + 1) {
    p_00 = p->FoundState + m;
    p_00->Symbol = (Byte)m;
    p_00->Freq = '\x01';
    SetSuccessor(p_00,0);
  }
  for (m = 0; m < 0x80; m = m + 1) {
    for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
      uVar1 = kInitBinEsc[local_18];
      for (s._4_4_ = 0; s._4_4_ < 0x40; s._4_4_ = s._4_4_ + 8) {
        p->BinSumm[m][(ulong)local_18 + (ulong)s._4_4_] = 0x4000 - (short)((uint)uVar1 / (m + 2));
      }
    }
  }
  for (m = 0; m < 0x19; m = m + 1) {
    for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
      pCVar2 = p->See[m] + local_18;
      pCVar2->Shift = '\x03';
      pCVar2->Summ = ((short)m * 5 + 10) * 8;
      pCVar2->Count = '\x04';
    }
  }
  return;
}

Assistant:

static void RestartModel(CPpmd7 *p)
{
  unsigned i, k, m;

  memset(p->FreeList, 0, sizeof(p->FreeList));
  p->Text = p->Base + p->AlignOffset;
  p->HiUnit = p->Text + p->Size;
  p->LoUnit = p->UnitsStart = p->HiUnit - p->Size / 8 / UNIT_SIZE * 7 * UNIT_SIZE;
  p->GlueCount = 0;

  p->OrderFall = p->MaxOrder;
  p->RunLength = p->InitRL = -(Int32)((p->MaxOrder < 12) ? p->MaxOrder : 12) - 1;
  p->PrevSuccess = 0;

  p->MinContext = p->MaxContext = (CTX_PTR)(p->HiUnit -= UNIT_SIZE); /* AllocContext(p); */
  p->MinContext->Suffix = 0;
  p->MinContext->NumStats = 256;
  p->MinContext->SummFreq = 256 + 1;
  p->FoundState = (CPpmd_State *)p->LoUnit; /* AllocUnits(p, PPMD_NUM_INDEXES - 1); */
  p->LoUnit += U2B(256 / 2);
  p->MinContext->Stats = REF(p->FoundState);
  for (i = 0; i < 256; i++)
  {
    CPpmd_State *s = &p->FoundState[i];
    s->Symbol = (Byte)i;
    s->Freq = 1;
    SetSuccessor(s, 0);
  }

  for (i = 0; i < 128; i++)
    for (k = 0; k < 8; k++)
    {
      UInt16 *dest = p->BinSumm[i] + k;
      UInt16 val = (UInt16)(PPMD_BIN_SCALE - kInitBinEsc[k] / (i + 2));
      for (m = 0; m < 64; m += 8)
        dest[m] = val;
    }
  
  for (i = 0; i < 25; i++)
    for (k = 0; k < 16; k++)
    {
      CPpmd_See *s = &p->See[i][k];
      s->Summ = (UInt16)((5 * i + 10) << (s->Shift = PPMD_PERIOD_BITS - 4));
      s->Count = 4;
    }
}